

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# property.cpp
# Opt level: O0

void __thiscall camp::Property::Property(Property *this,string *name,Type type)

{
  bool local_2e;
  bool local_2d [17];
  Type local_1c;
  string *psStack_18;
  Type type_local;
  string *name_local;
  Property *this_local;
  
  local_1c = type;
  psStack_18 = name;
  name_local = (string *)this;
  TagHolder::TagHolder(&this->super_TagHolder);
  (this->super_TagHolder)._vptr_TagHolder = (_func_int **)&PTR__Property_001fd218;
  std::__cxx11::string::string((string *)&this->m_name,(string *)psStack_18);
  this->m_type = local_1c;
  local_2d[0] = true;
  detail::Getter<bool>::Getter(&this->m_readable,local_2d);
  local_2e = true;
  detail::Getter<bool>::Getter(&this->m_writable,&local_2e);
  return;
}

Assistant:

Property::Property(const std::string& name, Type type)
    : m_name(name)
    , m_type(type)
    , m_readable(true)
    , m_writable(true)
{
}